

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_helper.c
# Opt level: O0

void helper_mvcin(CPUS390XState_conflict *env,uint32_t l,uint64_t dest,uint64_t src)

{
  uint8_t byte;
  int mmu_idx_00;
  uint size;
  uint64_t vaddr;
  uintptr_t unaff_retaddr;
  undefined1 local_e0 [7];
  uint8_t x;
  S390Access local_b8;
  uint local_8c;
  uintptr_t uStack_88;
  int i;
  uintptr_t ra;
  S390Access desta;
  S390Access srca;
  int mmu_idx;
  uint64_t src_local;
  uint64_t dest_local;
  uint32_t l_local;
  CPUS390XState_conflict *env_local;
  
  mmu_idx_00 = cpu_mmu_index(env,false);
  size = l + 1;
  uStack_88 = unaff_retaddr;
  vaddr = wrap_address(env,(src - size) + 1);
  access_prepare(&local_b8,env,vaddr,size,MMU_DATA_LOAD,mmu_idx_00,uStack_88);
  memcpy(&desta.size1,&local_b8,0x28);
  access_prepare((S390Access *)local_e0,env,dest,size,MMU_DATA_STORE,mmu_idx_00,uStack_88);
  memcpy(&ra,local_e0,0x28);
  for (local_8c = 0; local_8c < size; local_8c = local_8c + 1) {
    byte = access_get_byte(env,(S390Access *)&desta.size1,(size - local_8c) + -1,uStack_88);
    access_set_byte(env,(S390Access *)&ra,local_8c,byte,uStack_88);
  }
  return;
}

Assistant:

void HELPER(mvcin)(CPUS390XState *env, uint32_t l, uint64_t dest, uint64_t src)
{
    const int mmu_idx = cpu_mmu_index(env, false);
    S390Access srca, desta;
    uintptr_t ra = GETPC();
    int i;

    /* MVCIN always copies one more byte than specified - maximum is 256 */
    l++;

    src = wrap_address(env, src - l + 1);
    srca = access_prepare(env, src, l, MMU_DATA_LOAD, mmu_idx, ra);
    desta = access_prepare(env, dest, l, MMU_DATA_STORE, mmu_idx, ra);
    for (i = 0; i < l; i++) {
        const uint8_t x = access_get_byte(env, &srca, l - i - 1, ra);

        access_set_byte(env, &desta, i, x, ra);
    }
}